

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystementry.cpp
# Opt level: O1

void __thiscall QFileSystemEntry::findFileNameSeparators(QFileSystemEntry *this)

{
  char16_t cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  short sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  char16_t *pcVar12;
  
  if (this->m_firstDotInFileName == -2) {
    resolveFilePath(this);
    uVar5._0_2_ = this->m_lastSeparator;
    uVar5._2_2_ = this->m_firstDotInFileName;
    sVar6 = -1;
    if (-1 < (short)(undefined2)uVar5) {
      sVar6 = (undefined2)uVar5;
    }
    uVar8 = 0;
    if (0 < (short)(undefined2)uVar5) {
      uVar8 = uVar5;
    }
    uVar8 = uVar8 & 0xffff;
    uVar10 = (uint)(this->m_filePath).d.size;
    uVar5 = uVar10 - 1;
    if ((int)(uVar8 - 1) < (int)uVar5) {
      uVar5 = uVar8 - 1;
    }
    do {
      uVar9 = uVar10;
      uVar10 = uVar9 - 1;
      uVar7 = (int)sVar6;
      uVar11 = uVar5;
      uVar3 = 0xffffffff;
      if (((int)uVar10 < (int)uVar8) ||
         (cVar1 = (this->m_filePath).d.ptr[uVar10], uVar11 = uVar10, uVar3 = uVar10, cVar1 == L'.'))
      break;
      uVar7 = uVar10;
      uVar3 = 0xffffffff;
    } while (cVar1 != L'/');
    uVar5 = uVar7;
    uVar10 = uVar3;
    if ((uVar7 != uVar11) && ((int)uVar8 <= (int)(uVar9 - 2))) {
      pcVar12 = (this->m_filePath).d.ptr + (uVar9 - 2);
      uVar11 = uVar9 - 2;
      do {
        uVar9 = uVar11;
        if ((*pcVar12 != L'.') && (uVar5 = uVar11, uVar9 = uVar10, *pcVar12 == L'/')) break;
        uVar10 = uVar9;
        pcVar12 = pcVar12 + -1;
        bVar2 = (int)uVar8 < (int)uVar11;
        uVar5 = uVar7;
        uVar11 = uVar11 - 1;
      } while (bVar2);
    }
    this->m_lastSeparator = (qint16)uVar5;
    uVar8 = 0;
    if (0 < (int)uVar5) {
      uVar8 = uVar5;
    }
    sVar6 = -1;
    if (uVar10 != 0xffffffff) {
      sVar6 = (short)uVar10 - (short)uVar8;
    }
    this->m_firstDotInFileName = sVar6;
    if (uVar3 == 0xffffffff) {
      iVar4 = 0xffff;
    }
    else {
      iVar4 = uVar3 - uVar10;
      if (iVar4 == 0) {
        iVar4 = 0;
      }
    }
    this->m_lastDotInFileName = (qint16)iVar4;
  }
  return;
}

Assistant:

void QFileSystemEntry::findFileNameSeparators() const
{
    if (m_firstDotInFileName == Uninitialized) {
        resolveFilePath();
        int firstDotInFileName = -1;
        int lastDotInFileName = -1;
        int lastSeparator = m_lastSeparator;

        int stop;
        if (lastSeparator < 0) {
            lastSeparator = -1;
            stop = 0;
        } else {
            stop = lastSeparator;
        }

        int i = m_filePath.size() - 1;
        for (; i >= stop; --i) {
            if (m_filePath.at(i).unicode() == '.') {
                firstDotInFileName = lastDotInFileName = i;
                break;
            } else if (m_filePath.at(i).unicode() == '/') {
                lastSeparator = i;
                break;
            }
        }

        if (lastSeparator != i) {
            for (--i; i >= stop; --i) {
                if (m_filePath.at(i).unicode() == '.')
                    firstDotInFileName = i;
                else if (m_filePath.at(i).unicode() == '/') {
                    lastSeparator = i;
                    break;
                }
            }
        }
        m_lastSeparator = lastSeparator;
        m_firstDotInFileName = firstDotInFileName == -1 ? -1 : firstDotInFileName - qMax(0, lastSeparator);
        if (lastDotInFileName == -1)
            m_lastDotInFileName = -1;
        else if (firstDotInFileName == lastDotInFileName)
            m_lastDotInFileName = 0;
        else
            m_lastDotInFileName = lastDotInFileName - firstDotInFileName;
    }
}